

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9PoXsim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint nFrames;
  Vec_Int_t *pVVar3;
  char *pcVar4;
  uint fVerbose;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nFrames = 1000;
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"Fvh"), iVar1 = globalUtilOptind, iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        pcVar4 = "Abc_CommandAbc9Bmci(): There is no AIG.\n";
      }
      else {
        if (pAbc->pGia->nRegs != 0) {
          pVVar3 = pAbc->vAbcObjIds;
          if (pVVar3 != (Vec_Int_t *)0x0) {
            if (pVVar3->pArray != (int *)0x0) {
              free(pVVar3->pArray);
              pAbc->vAbcObjIds->pArray = (int *)0x0;
              pVVar3 = pAbc->vAbcObjIds;
              if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_0028efd3;
            }
            free(pVVar3);
            pAbc->vAbcObjIds = (Vec_Int_t *)0x0;
          }
LAB_0028efd3:
          pVVar3 = Gia_ManPoXSim(pAbc->pGia,nFrames,fVerbose);
          pAbc->vAbcObjIds = pVVar3;
          return 0;
        }
        pcVar4 = "Abc_CommandAbc9Bmci(): AIG is combinational.\n";
      }
      Abc_Print(-1,pcVar4);
      return 0;
    }
    if (iVar2 != 0x46) goto LAB_0028f02b;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      goto LAB_0028f02b;
    }
    nFrames = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar1 + 1;
    if ((int)nFrames < 0) {
LAB_0028f02b:
      Abc_Print(-2,"usage: &poxsim [-F num] [-vh]\n");
      Abc_Print(-2,"\t         X-valued simulation of the multi-output sequential miter\n");
      Abc_Print(-2,"\t-F num : the number of timeframes [default = %d]\n",(ulong)nFrames);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9PoXsim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Int_t * Gia_ManPoXSim( Gia_Man_t * p, int nFrames, int fVerbose );
    int c, nFrames = 1000, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmci(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmci(): AIG is combinational.\n" );
        return 0;
    }
    Vec_IntFreeP( &pAbc->vAbcObjIds );
    pAbc->vAbcObjIds = Gia_ManPoXSim( pAbc->pGia, nFrames, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &poxsim [-F num] [-vh]\n" );
    Abc_Print( -2, "\t         X-valued simulation of the multi-output sequential miter\n" );
    Abc_Print( -2, "\t-F num : the number of timeframes [default = %d]\n",                    nFrames );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",        fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}